

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::allInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this)

{
  pointer pOVar1;
  Molecule *pMVar2;
  Atom *pAVar3;
  RigidBody *pRVar4;
  Bond *pBVar5;
  Bend *pBVar6;
  Torsion *pTVar7;
  Inversion *pIVar8;
  pointer ppAVar9;
  pointer ppRVar10;
  pointer ppBVar11;
  pointer ppBVar12;
  pointer ppTVar13;
  pointer ppIVar14;
  MoleculeIterator mi;
  MoleculeIterator local_30;
  
  createSelectionSets(__return_storage_ptr__,this);
  local_30._M_node = (_Base_ptr)0x0;
  pMVar2 = SimInfo::beginMolecule(this->info,&local_30);
  while (pMVar2 != (Molecule *)0x0) {
    ppAVar9 = (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar9 !=
        (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_0021acff;
    pAVar3 = (Atom *)0x0;
    while (pAVar3 != (Atom *)0x0) {
      OpenMDBitSet::setBitOn
                ((__return_storage_ptr__->bitsets_).
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (long)(pAVar3->super_StuntDouble).globalIndex_);
      ppAVar9 = ppAVar9 + 1;
      pAVar3 = (Atom *)0x0;
      if (ppAVar9 !=
          (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_0021acff:
        pAVar3 = *ppAVar9;
      }
    }
    ppRVar10 = (pMVar2->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppRVar10 !=
        (pMVar2->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021ad3d;
    pRVar4 = (RigidBody *)0x0;
    while (pRVar4 != (RigidBody *)0x0) {
      OpenMDBitSet::setBitOn
                ((__return_storage_ptr__->bitsets_).
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (long)(pRVar4->super_StuntDouble).globalIndex_);
      ppRVar10 = ppRVar10 + 1;
      pRVar4 = (RigidBody *)0x0;
      if (ppRVar10 !=
          (pMVar2->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021ad3d:
        pRVar4 = *ppRVar10;
      }
    }
    ppBVar11 = (pMVar2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar11 !=
        (pMVar2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_0021ad76;
    pBVar5 = (Bond *)0x0;
    while (pBVar5 != (Bond *)0x0) {
      OpenMDBitSet::setBitOn
                ((__return_storage_ptr__->bitsets_).
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1,
                 (long)(pBVar5->super_ShortRangeInteraction).globalIndex_);
      ppBVar11 = ppBVar11 + 1;
      pBVar5 = (Bond *)0x0;
      if (ppBVar11 !=
          (pMVar2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_0021ad76:
        pBVar5 = *ppBVar11;
      }
    }
    ppBVar12 = (pMVar2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar12 !=
        (pMVar2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_0021adaf;
    pBVar6 = (Bend *)0x0;
    while (pBVar6 != (Bend *)0x0) {
      OpenMDBitSet::setBitOn
                ((__return_storage_ptr__->bitsets_).
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start + 2,
                 (long)(pBVar6->super_ShortRangeInteraction).globalIndex_);
      ppBVar12 = ppBVar12 + 1;
      pBVar6 = (Bend *)0x0;
      if (ppBVar12 !=
          (pMVar2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_0021adaf:
        pBVar6 = *ppBVar12;
      }
    }
    ppTVar13 = (pMVar2->torsions_).
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppTVar13 !=
        (pMVar2->torsions_).
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021ade8;
    pTVar7 = (Torsion *)0x0;
    while (pTVar7 != (Torsion *)0x0) {
      OpenMDBitSet::setBitOn
                ((__return_storage_ptr__->bitsets_).
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start + 3,
                 (long)(pTVar7->super_ShortRangeInteraction).globalIndex_);
      ppTVar13 = ppTVar13 + 1;
      pTVar7 = (Torsion *)0x0;
      if (ppTVar13 !=
          (pMVar2->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021ade8:
        pTVar7 = *ppTVar13;
      }
    }
    ppIVar14 = (pMVar2->inversions_).
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppIVar14 !=
        (pMVar2->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021ae24;
    pIVar8 = (Inversion *)0x0;
    while (pOVar1 = (__return_storage_ptr__->bitsets_).
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_start, pIVar8 != (Inversion *)0x0) {
      OpenMDBitSet::setBitOn(pOVar1 + 4,(long)(pIVar8->super_ShortRangeInteraction).globalIndex_);
      ppIVar14 = ppIVar14 + 1;
      pIVar8 = (Inversion *)0x0;
      if (ppIVar14 !=
          (pMVar2->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021ae24:
        pIVar8 = *ppIVar14;
      }
    }
    OpenMDBitSet::setBitOn(pOVar1 + 5,(long)pMVar2->globalIndex_);
    pMVar2 = SimInfo::nextMolecule(this->info,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::allInstruction() {
    SelectionSet ss = createSelectionSets();

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    // Doing the loop insures that we're actually on this processor.

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        ss.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        ss.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        ss.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        ss.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
      }
      ss.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
    }

    return ss;
  }